

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

int obj_nsiginlets(t_object *x)

{
  _inlet *local_20;
  _inlet *i;
  int n;
  t_object *x_local;
  
  local_20 = x->te_inlet;
  i._4_4_ = 0;
  for (; local_20 != (_inlet *)0x0; local_20 = local_20->i_next) {
    if (local_20->i_symfrom == &s_signal) {
      i._4_4_ = i._4_4_ + 1;
    }
  }
  if ((((x->te_g).g_pd)->c_firstin != '\0') && (((x->te_g).g_pd)->c_floatsignalin != 0)) {
    i._4_4_ = i._4_4_ + 1;
  }
  return i._4_4_;
}

Assistant:

int obj_nsiginlets(const t_object *x)
{
    int n;
    t_inlet *i;
    for (i = x->ob_inlet, n = 0; i; i = i->i_next)
        if (i->i_symfrom == &s_signal) n++;
    if (x->ob_pd->c_firstin && x->ob_pd->c_floatsignalin) n++;
    return (n);
}